

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O0

string * sc_core::sc_vector_base::make_name_abi_cxx11_(char *prefix,size_type param_2)

{
  char *pcVar1;
  string *in_RDI;
  undefined8 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  allocator *paVar2;
  allocator local_19 [25];
  
  pcVar1 = sc_gen_unique_name(in_stack_ffffffffffffffc8,
                              SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
  paVar2 = local_19;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,paVar2);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  return in_RDI;
}

Assistant:

std::string
sc_vector_base::make_name( const char* prefix, size_type /* idx */ )
{
  // TODO: How to handle name clashes due to interleaved vector
  //       creation and init()?
  //       sc_vector< foo > v1, v2;
  //       v1.name() == "vector", v2.name() == "vector_0"
  //       v1.init( 1 ); -> v1[0].name() == "vector_0" -> clash
  return sc_gen_unique_name( prefix );
}